

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

void __thiscall QTableModel::removeItem(QTableModel *this,QTableWidgetItem *item)

{
  int iVar1;
  qsizetype qVar2;
  reference ppQVar3;
  int in_ESI;
  QTableWidgetItem **in_RDI;
  long in_FS_OFFSET;
  int i;
  QModelIndex idx;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined1 local_40 [24];
  undefined1 local_28 [16];
  QTableWidgetItem *local_18;
  int local_10;
  QTableWidgetItem **local_8;
  
  local_8 = *(QTableWidgetItem ***)(in_FS_OFFSET + 0x28);
  local_10 = in_ESI;
  qVar2 = QListSpecialMethodsBase<QTableWidgetItem*>::indexOf<QTableWidgetItem*>
                    ((QListSpecialMethodsBase<QTableWidgetItem_*> *)
                     CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),in_RDI,0x8d52fb);
  iVar1 = (int)qVar2;
  if (iVar1 == -1) {
    qVar2 = QListSpecialMethodsBase<QTableWidgetItem*>::indexOf<QTableWidgetItem*>
                      ((QListSpecialMethodsBase<QTableWidgetItem_*> *)
                       CONCAT44(0xffffffff,in_stack_ffffffffffffffb0),in_RDI,0x8d53b0);
    iVar1 = (int)qVar2;
    if (iVar1 == -1) {
      qVar2 = QListSpecialMethodsBase<QTableWidgetItem*>::indexOf<QTableWidgetItem*>
                        ((QListSpecialMethodsBase<QTableWidgetItem_*> *)
                         CONCAT44(0xffffffff,in_stack_ffffffffffffffb0),in_RDI,0x8d5402);
      iVar1 = (int)qVar2;
      if (iVar1 != -1) {
        ppQVar3 = QList<QTableWidgetItem_*>::operator[]
                            ((QList<QTableWidgetItem_*> *)CONCAT44(iVar1,in_stack_ffffffffffffffb0),
                             (qsizetype)in_RDI);
        *ppQVar3 = (QTableWidgetItem *)0x0;
        QAbstractItemModel::headerDataChanged((Orientation)in_RDI,1,iVar1);
      }
    }
    else {
      ppQVar3 = QList<QTableWidgetItem_*>::operator[]
                          ((QList<QTableWidgetItem_*> *)CONCAT44(iVar1,in_stack_ffffffffffffffb0),
                           (qsizetype)in_RDI);
      *ppQVar3 = (QTableWidgetItem *)0x0;
      QAbstractItemModel::headerDataChanged((Orientation)in_RDI,2,iVar1);
    }
  }
  else {
    local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = (QTableWidgetItem *)&DAT_aaaaaaaaaaaaaaaa;
    index((QTableModel *)local_28,(char *)in_RDI,local_10);
    ppQVar3 = QList<QTableWidgetItem_*>::operator[]
                        ((QList<QTableWidgetItem_*> *)CONCAT44(iVar1,in_stack_ffffffffffffffb0),
                         (qsizetype)in_RDI);
    *ppQVar3 = (QTableWidgetItem *)0x0;
    memset(local_40,0,0x18);
    QList<int>::QList((QList<int> *)0x8d5375);
    QAbstractItemModel::dataChanged
              ((QModelIndex *)in_RDI,(QModelIndex *)local_28,(QList_conflict2 *)local_28);
    QList<int>::~QList((QList<int> *)0x8d5395);
  }
  if (*(QTableWidgetItem ***)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableModel::removeItem(QTableWidgetItem *item)
{
    int i = tableItems.indexOf(item);
    if (i != -1) {
        QModelIndex idx = index(item);
        tableItems[i] = nullptr;
        emit dataChanged(idx, idx);
        return;
    }

    i = verticalHeaderItems.indexOf(item);

    if (i != -1) {
        verticalHeaderItems[i] = 0;
        emit headerDataChanged(Qt::Vertical, i, i);
        return;
    }
    i = horizontalHeaderItems.indexOf(item);
    if (i != -1) {
        horizontalHeaderItems[i] = 0;
        emit headerDataChanged(Qt::Horizontal, i, i);
        return;
    }
}